

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O0

void __thiscall
OptionParser_UnknownLongOption_Test::OptionParser_UnknownLongOption_Test
          (OptionParser_UnknownLongOption_Test *this)

{
  OptionParser_UnknownLongOption_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__OptionParser_UnknownLongOption_Test_003f5648;
  return;
}

Assistant:

TEST(OptionParser, UnknownLongOption) {
  std::string error;
  OptionParser parser("prog", "desc");
  parser.SetErrorCallback([&](const char* msg) { error = msg; });
  const char* args[] = {"prog name", "--foo"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(error, "prog: unknown option '--foo'" ERROR_ENDING);
}